

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

int main_internal(string_array *cmd_line,int num_helper_threads,ilzham *lzham_dll)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  lzham_compress_level lVar4;
  int iVar5;
  uint uVar6;
  uint __seed;
  size_type sVar7;
  reference pvVar8;
  char *pcVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined1 *puVar12;
  long lVar13;
  undefined8 uVar14;
  int in_ESI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  int64 in_stack_000000a0;
  int64 in_stack_000000a8;
  file_stats_vec *in_stack_000000b0;
  char *in_stack_000000b8;
  char *in_stack_000000c0;
  ilzham *in_stack_000000c8;
  comp_options in_stack_000000e0;
  uint i_1;
  char decomp_file [256];
  bool comp_result;
  string *cmp_file;
  string *src_file;
  int exit_status;
  int seed;
  int update_rate;
  int num_threads;
  int comp_level;
  int dict_size;
  string *str;
  int i;
  string seed_filename;
  op_mode_t op_mode;
  comp_options options;
  comp_options *in_stack_00000500;
  ilzham *in_stack_00000508;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc48;
  comp_options *in_stack_fffffffffffffc50;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffc58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc60;
  const_iterator in_stack_fffffffffffffc68;
  undefined8 local_338;
  char *pFilename2;
  undefined1 local_288 [40];
  undefined1 local_260 [44];
  int local_234;
  undefined1 local_230 [8];
  float *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  ilzham *in_stack_fffffffffffffdf8;
  comp_options in_stack_fffffffffffffe10;
  float *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  comp_options *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  ilzham *in_stack_fffffffffffffe68;
  uint local_ec;
  string local_70 [36];
  int local_4c;
  comp_options local_48;
  int local_14;
  uint local_4;
  
  local_14 = in_ESI;
  comp_options::comp_options(&local_48);
  local_48.m_max_helper_threads = local_14;
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar7 == 0) {
    print_usage();
    iVar3 = simple_test(in_stack_00000508,in_stack_00000500);
    return iVar3;
  }
  local_4c = -1;
  std::__cxx11::string::string(local_70);
  while (sVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(in_RDI), 0 < (int)sVar7) {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](in_RDI,0);
    pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)pvVar8);
    if (*pcVar9 != '-') {
      if (((local_48.m_unbuffered_decompression & 1U) != 0) &&
         (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
        print_error("Unbuffered decompression is not compatible with seed files!\n");
        local_4 = 1;
        goto LAB_0010a9c2;
      }
      lVar13 = std::__cxx11::string::size();
      if (lVar13 != 1) {
        uVar11 = std::__cxx11::string::c_str();
        print_error("Invalid mode: %s\n",uVar11);
        local_4 = 1;
        goto LAB_0010a9c2;
      }
      pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)pvVar8);
      iVar3 = tolower((int)*pcVar9);
      if (iVar3 == 0x61) {
        local_4c = 2;
      }
      else if (iVar3 == 99) {
        local_4c = 0;
      }
      else {
        if (iVar3 != 100) {
          uVar11 = std::__cxx11::string::c_str();
          print_error("Invalid mode: %s\n",uVar11);
          local_4 = 1;
          goto LAB_0010a9c2;
        }
        local_4c = 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin(in_stack_fffffffffffffc48);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator+(in_stack_fffffffffffffc58,(difference_type)in_stack_fffffffffffffc50);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffc50,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffc48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(in_stack_fffffffffffffc60,in_stack_fffffffffffffc68);
      break;
    }
    uVar10 = std::__cxx11::string::size();
    if (uVar10 < 2) {
      uVar11 = std::__cxx11::string::c_str();
      print_error("Invalid option: %s\n",uVar11);
      local_4 = 1;
      goto LAB_0010a9c2;
    }
    puVar12 = (undefined1 *)std::__cxx11::string::operator[]((ulong)pvVar8);
    lVar4 = local_48.m_comp_level;
    iVar3 = local_48.m_dict_size_log2;
    iVar5 = local_48.m_max_helper_threads;
    uVar6 = local_48.m_table_update_rate;
    switch(*puVar12) {
    case 0x46:
      local_48.m_low_memory_finder = true;
      break;
    default:
      uVar11 = std::__cxx11::string::c_str();
      print_error("Invalid option: %s\n",uVar11);
      local_4 = 1;
      goto LAB_0010a9c2;
    case 0x61:
      lVar13 = std::__cxx11::string::c_str();
      std::__cxx11::string::operator=(local_70,(char *)(lVar13 + 2));
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) != 0) {
        print_error("Must specify seed filename with -a option!\n");
        local_4 = 1;
        goto LAB_0010a9c2;
      }
      uVar11 = std::__cxx11::string::c_str();
      printf("Seed filename: %s\n",uVar11);
      lVar4 = local_48.m_comp_level;
      iVar3 = local_48.m_dict_size_log2;
      iVar5 = local_48.m_max_helper_threads;
      uVar6 = local_48.m_table_update_rate;
      break;
    case 0x62:
      local_48.m_force_single_threaded_parsing = true;
      break;
    case 99:
      local_48.m_compute_adler32_during_decomp = false;
      break;
    case 100:
      lVar13 = std::__cxx11::string::c_str();
      iVar3 = atoi((char *)(lVar13 + 2));
      if ((iVar3 < 0xf) ||
         (lVar4 = local_48.m_comp_level, iVar5 = local_48.m_max_helper_threads,
         uVar6 = local_48.m_table_update_rate, 0x1d < iVar3)) {
        uVar11 = std::__cxx11::string::c_str();
        print_error("Invalid dictionary size: %s\n",uVar11);
        local_4 = 1;
        goto LAB_0010a9c2;
      }
      break;
    case 0x65:
      local_48.m_deterministic_parsing = true;
      break;
    case 0x66:
      lVar13 = std::__cxx11::string::c_str();
      local_48.m_fast_bytes = atoi((char *)(lVar13 + 2));
      lVar4 = local_48.m_comp_level;
      iVar3 = local_48.m_dict_size_log2;
      iVar5 = local_48.m_max_helper_threads;
      uVar6 = local_48.m_table_update_rate;
      break;
    case 0x68:
      lVar13 = std::__cxx11::string::c_str();
      uVar6 = atoi((char *)(lVar13 + 2));
      if (((int)uVar6 < 0) ||
         (lVar4 = local_48.m_comp_level, iVar3 = local_48.m_dict_size_log2,
         iVar5 = local_48.m_max_helper_threads, 0x14 < (int)uVar6)) {
        uVar11 = std::__cxx11::string::c_str();
        print_error("Invalid table update rate: %s\n",uVar11);
        local_4 = 1;
        goto LAB_0010a9c2;
      }
      break;
    case 0x69:
      local_48.m_test_compressor_reinit = true;
      local_48.m_deterministic_parsing = true;
      break;
    case 0x6d:
      lVar13 = std::__cxx11::string::c_str();
      lVar4 = atoi((char *)(lVar13 + 2));
      if (((int)lVar4 < 0) ||
         (iVar3 = local_48.m_dict_size_log2, iVar5 = local_48.m_max_helper_threads,
         uVar6 = local_48.m_table_update_rate, 4 < (int)lVar4)) {
        uVar11 = std::__cxx11::string::c_str();
        print_error("Invalid compression level: %s\n",uVar11);
        local_4 = 1;
        goto LAB_0010a9c2;
      }
      break;
    case 0x6f:
      local_48.m_tradeoff_decomp_rate_for_comp_ratio = true;
      break;
    case 0x72:
      local_48.m_randomize_params = true;
      break;
    case 0x73:
      lVar13 = std::__cxx11::string::c_str();
      __seed = atoi((char *)(lVar13 + 2));
      srand(__seed);
      printf("Using random seed: %i\n",(ulong)__seed);
      lVar4 = local_48.m_comp_level;
      iVar3 = local_48.m_dict_size_log2;
      iVar5 = local_48.m_max_helper_threads;
      uVar6 = local_48.m_table_update_rate;
      break;
    case 0x74:
      lVar13 = std::__cxx11::string::c_str();
      iVar5 = atoi((char *)(lVar13 + 2));
      if ((iVar5 < 0) ||
         (lVar4 = local_48.m_comp_level, iVar3 = local_48.m_dict_size_log2,
         uVar6 = local_48.m_table_update_rate, 0x40 < iVar5)) {
        uVar11 = std::__cxx11::string::c_str();
        print_error("Invalid number of helper threads: %s\n",uVar11);
        local_4 = 1;
        goto LAB_0010a9c2;
      }
      break;
    case 0x75:
      local_48.m_unbuffered_decompression = true;
      break;
    case 0x76:
      local_48.m_verify_compressed_data = true;
      break;
    case 0x78:
      local_48.m_extreme_parsing = true;
      pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)pvVar8);
      lVar4 = local_48.m_comp_level;
      iVar3 = local_48.m_dict_size_log2;
      iVar5 = local_48.m_max_helper_threads;
      uVar6 = local_48.m_table_update_rate;
      if (*pcVar9 != '\0') {
        lVar13 = std::__cxx11::string::c_str();
        local_48.m_max_best_arrivals = atoi((char *)(lVar13 + 2));
        lVar4 = local_48.m_comp_level;
        iVar3 = local_48.m_dict_size_log2;
        iVar5 = local_48.m_max_helper_threads;
        uVar6 = local_48.m_table_update_rate;
      }
    }
    local_48.m_table_update_rate = uVar6;
    local_48.m_max_helper_threads = iVar5;
    local_48.m_dict_size_log2 = iVar3;
    local_48.m_comp_level = lVar4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin(in_stack_fffffffffffffc48);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator+(in_stack_fffffffffffffc58,(difference_type)in_stack_fffffffffffffc50);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffc50,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffc48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(in_stack_fffffffffffffc60,in_stack_fffffffffffffc68);
  }
  if (local_4c == -1) {
    print_error("No mode specified!\n");
    print_usage();
    local_4 = 1;
    goto LAB_0010a9c2;
  }
  printf("Using options:\n");
  comp_options::print(in_stack_fffffffffffffc50);
  printf("\n");
  local_ec = 1;
  if (local_4c == 0) {
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (sVar7 < 2) {
      print_error("Must specify input and output filenames!\n");
      local_4 = 1;
      goto LAB_0010a9c2;
    }
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (2 < sVar7) {
      print_error("Too many filenames!\n");
      local_4 = 1;
      goto LAB_0010a9c2;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDI,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDI,1);
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    lVar13 = std::__cxx11::string::length();
    if (lVar13 != 0) {
      std::__cxx11::string::c_str();
    }
    bVar2 = compress_file(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                          in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                          in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    local_ec = (uint)!bVar2;
    if ((bVar2) && ((local_48.m_verify_compressed_data & 1U) != 0)) {
      pcVar9 = &stack0xfffffffffffffdf8;
      dVar1 = timer::get_ms();
      sprintf(pcVar9,"__decomp_temp_%u__.tmp",(long)dVar1 & 0xffffffff);
      std::__cxx11::string::c_str();
      pFilename2 = &stack0xfffffffffffffdf8;
      memcpy(local_230,&local_48,0x28);
      lVar13 = std::__cxx11::string::length();
      if (lVar13 != 0) {
        std::__cxx11::string::c_str();
      }
      bVar2 = decompress_file(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                              in_stack_fffffffffffffde8,in_stack_fffffffffffffe10,
                              in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      if (!bVar2) {
        uVar11 = std::__cxx11::string::c_str();
        lVar13 = std::__cxx11::string::length();
        if (lVar13 == 0) {
          local_338 = 0;
        }
        else {
          local_338 = std::__cxx11::string::c_str();
        }
        print_error("Failed decompressing file \"%s\" to \"%s\"\n",uVar11,&stack0xfffffffffffffdf8,
                    local_338);
        local_4 = 1;
        goto LAB_0010a9c2;
      }
      uVar11 = std::__cxx11::string::c_str();
      printf("Comparing file \"%s\" to \"%s\"\n",&stack0xfffffffffffffdf8,uVar11);
      std::__cxx11::string::c_str();
      bVar2 = compare_files(pcVar9,pFilename2);
      if (!bVar2) {
        uVar11 = std::__cxx11::string::c_str();
        uVar14 = std::__cxx11::string::c_str();
        print_error("Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n",
                    uVar11,uVar14);
        local_4 = 1;
        goto LAB_0010a9c2;
      }
      printf("Decompressed file compared OK to original file.\n");
      remove(&stack0xfffffffffffffdf8);
    }
  }
  else if (local_4c == 1) {
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (sVar7 < 2) {
      print_error("Must specify input and output filenames!\n");
      local_4 = 1;
      goto LAB_0010a9c2;
    }
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (2 < sVar7) {
      print_error("Too many filenames!\n");
      local_4 = 1;
      goto LAB_0010a9c2;
    }
    for (local_234 = 0; local_234 == 0; local_234 = local_234 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,0);
      std::__cxx11::string::c_str();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,1);
      std::__cxx11::string::c_str();
      memcpy(local_260,&local_48,0x28);
      lVar13 = std::__cxx11::string::length();
      if (lVar13 != 0) {
        std::__cxx11::string::c_str();
      }
      bVar2 = decompress_file(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                              in_stack_fffffffffffffde8,in_stack_fffffffffffffe10,
                              in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      if (!bVar2) break;
      local_ec = 0;
    }
  }
  else {
    if (local_4c != 2) {
      print_error("No mode specified!\n");
      print_usage();
      local_4 = 1;
      goto LAB_0010a9c2;
    }
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (sVar7 == 0) {
      print_error("No directory specified!\n");
      local_4 = 1;
      goto LAB_0010a9c2;
    }
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (sVar7 != 1) {
      print_error("Too many filenames!\n");
      local_4 = 1;
      goto LAB_0010a9c2;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDI,0);
    std::__cxx11::string::c_str();
    memcpy(local_288,&local_48,0x28);
    lVar13 = std::__cxx11::string::length();
    if (lVar13 != 0) {
      std::__cxx11::string::c_str();
    }
    bVar2 = test_recursive(in_stack_000000c8,in_stack_000000c0,in_stack_000000e0,in_stack_000000b8,
                           in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
    local_ec = (uint)!bVar2;
  }
  local_4 = local_ec;
LAB_0010a9c2:
  std::__cxx11::string::~string(local_70);
  return local_4;
}

Assistant:

int main_internal(string_array cmd_line, int num_helper_threads, ilzham &lzham_dll)
{
   comp_options options;
   options.m_max_helper_threads = num_helper_threads;

#ifdef _XBOX
   options.m_dict_size_log2 = 21;
#endif

   if (!cmd_line.size())
   {
      print_usage();
      return simple_test(lzham_dll, options);
   }

   enum op_mode_t
   {
      OP_MODE_INVALID = -1,
      OP_MODE_COMPRESS = 0,
      OP_MODE_DECOMPRESS = 1,
      OP_MODE_ALL = 2
   };

   op_mode_t op_mode = OP_MODE_INVALID;
   std::string seed_filename;

   for (int i = 0; i < (int)cmd_line.size(); i++)
   {
      const std::string &str = cmd_line[i];
      if (str[0] == '-')
      {
         if (str.size() < 2)
         {
            print_error("Invalid option: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
         switch (str[1])
         {
            case 'u':
            {
               options.m_unbuffered_decompression = true;
               break;
            }
            case 'd':
            {
               int dict_size = atoi(str.c_str() + 2);
               if ((dict_size < LZHAM_MIN_DICT_SIZE_LOG2) || (dict_size > LZHAMTEST_MAX_POSSIBLE_DICT_SIZE))
               {
                  print_error("Invalid dictionary size: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_dict_size_log2 = dict_size;
               break;
            }
            case 'm':
            {
               int comp_level = atoi(str.c_str() + 2);
               if ((comp_level < 0) || (comp_level > (int)LZHAM_COMP_LEVEL_UBER))
               {
                  print_error("Invalid compression level: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_comp_level = static_cast<lzham_compress_level>(comp_level);
               break;
            }
            case 't':
            {
               int num_threads = atoi(str.c_str() + 2);
               if ((num_threads < 0) || (num_threads > LZHAM_MAX_HELPER_THREADS))
               {
                  print_error("Invalid number of helper threads: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_max_helper_threads = num_threads;
               break;
            }
				case 'h':
				{
					int update_rate = atoi(str.c_str() + 2);
					if ((update_rate < 0) || (update_rate > LZHAM_FASTEST_TABLE_UPDATE_RATE))
					{
						print_error("Invalid table update rate: %s\n", str.c_str());
						return EXIT_FAILURE;
					}
					options.m_table_update_rate = update_rate;
					break;
				}
            case 'c':
            {
               options.m_compute_adler32_during_decomp = false;
               break;
            }
            case 'v':
            {
               options.m_verify_compressed_data = true;
               break;
            }
            case 'r':
            {
               options.m_randomize_params = true;
               break;
            }
            case 'x':
            {
               options.m_extreme_parsing = true;

               if (str[2])
               {
                  options.m_max_best_arrivals = atoi(str.c_str() + 2);
               }

               break;
            }
            case 'e':
            {
               options.m_deterministic_parsing = true;
               break;
            }
            case 'o':
            {
               options.m_tradeoff_decomp_rate_for_comp_ratio = true;
               break;
            }
            case 'i':
            {
               options.m_test_compressor_reinit = true;
               options.m_deterministic_parsing = true;
               break;
            }
            case 's':
            {
               int seed = atoi(str.c_str() + 2);
               srand(seed);
               printf("Using random seed: %i\n", seed);
               break;
            }
            case 'a':
            {
               seed_filename = str.c_str() + 2;
               if (seed_filename.empty())
               {
                  print_error("Must specify seed filename with -a option!\n");
                  return EXIT_FAILURE;
               }
               printf("Seed filename: %s\n", seed_filename.c_str());
               break;
            }
            case 'b':
            {
               options.m_force_single_threaded_parsing = true;
               break;
            }
            case 'F':
            {
               options.m_low_memory_finder = true;
               break;
            }
            case 'f':
            {
               options.m_fast_bytes = atoi(str.c_str() + 2);
               break;
            }
            default:
            {
               print_error("Invalid option: %s\n", str.c_str());
               return EXIT_FAILURE;
            }
         }

         cmd_line.erase(cmd_line.begin() + i);
         i--;

         continue;
      }

      if ((options.m_unbuffered_decompression) && (!seed_filename.empty()))
      {
         print_error("Unbuffered decompression is not compatible with seed files!\n");
         return EXIT_FAILURE;
      }

      if (str.size() != 1)
      {
         print_error("Invalid mode: %s\n", str.c_str());
         return EXIT_FAILURE;
      }
      switch (tolower(str[0]))
      {
         case 'c':
         {
            op_mode = OP_MODE_COMPRESS;
            break;
         }
         case 'd':
         {
            op_mode = OP_MODE_DECOMPRESS;
            break;
         }
         case 'a':
         {
            op_mode = OP_MODE_ALL;
            break;
         }
         default:
         {
            print_error("Invalid mode: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
      }
      cmd_line.erase(cmd_line.begin() + i);
      break;
   }

   if (op_mode == OP_MODE_INVALID)
   {
      print_error("No mode specified!\n");
      print_usage();
      return EXIT_FAILURE;
   }

   printf("Using options:\n");
   options.print();
   printf("\n");

   int exit_status = EXIT_FAILURE;

   switch (op_mode)
   {
      case OP_MODE_COMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

         const std::string &src_file = cmd_line[0];
         const std::string &cmp_file = cmd_line[1];

         bool comp_result = compress_file(lzham_dll, src_file.c_str(), cmp_file.c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL);
         if (comp_result)
            exit_status = EXIT_SUCCESS;

         if ((comp_result) && (options.m_verify_compressed_data))
         {
            char decomp_file[256];

#ifdef _XBOX
            sprintf(decomp_file, "e:\\__decomp_temp_%u__.tmp", (uint)GetTickCount());
#else
            sprintf(decomp_file, "__decomp_temp_%u__.tmp", (uint)timer::get_ms());
#endif
            if (!decompress_file(lzham_dll, cmp_file.c_str(), decomp_file, options, seed_filename.length() ? seed_filename.c_str() : NULL))
            {
               print_error("Failed decompressing file \"%s\" to \"%s\"\n", cmp_file.c_str(), decomp_file, seed_filename.length() ? seed_filename.c_str() : NULL);
               return EXIT_FAILURE;
            }

            printf("Comparing file \"%s\" to \"%s\"\n", decomp_file, src_file.c_str());

            if (!compare_files(decomp_file, src_file.c_str()))
            {
               print_error("Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n", src_file.c_str(), cmp_file.c_str());
               return EXIT_FAILURE;
            }
            else
            {
               printf("Decompressed file compared OK to original file.\n");
            }

            remove(decomp_file);
         }

         break;
      }
      case OP_MODE_DECOMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

         for (uint i = 0; i < 1; i++)
         {
            if (decompress_file(lzham_dll, cmd_line[0].c_str(), cmd_line[1].c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL))
               exit_status = EXIT_SUCCESS;
            else
               break;
         }
         break;
      }
      case OP_MODE_ALL:
      {
         if (!cmd_line.size())
         {
            print_error("No directory specified!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() != 1)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

#if 0
			file_stats_vec stats;

         if (test_recursive(lzham_dll, cmd_line[0].c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL, &stats, 1, 1024*1024*512))
				exit_status = EXIT_SUCCESS;

			FILE *pFile = fopen("stats.csv", "w");
			if (pFile)
			{
				const float cpu_slowdown = 12.0f;
				float low_bps = 10000.0f;
				float scale_bps = 3125000.0f / 5.0f;
				//const float low_bps = 10000.0f / 10.0f;
				//const float scale_bps = 3125000.0f / 10.0f;

				for (uint i = 0; i < stats.size(); i++)
				{
					fprintf(pFile, "%s, %" PRIi64 ", , %" PRIi64 ", %f, %f, %f, , %" PRIi64 ", %f, %f, %f",
						stats[i].m_filename.c_str(),
						stats[i].m_size,
						stats[i].m_lzma_size, ((1.0f - (static_cast<float>(stats[i].m_lzma_size) / stats[i].m_size)) * 100.0f), stats[i].m_lzma_comp_time, stats[i].m_lzma_decomp_time,
						stats[i].m_lzham_size, ((1.0f - (static_cast<float>(stats[i].m_lzham_size) / stats[i].m_size)) * 100.0f), stats[i].m_lzham_comp_time, stats[i].m_lzham_decomp_time);

#if 0
					fprintf(pFile, ",");
					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_lzma_size / bps;
						float decomp_time = stats[i].m_lzma_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", stats[i].m_size / total_time / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_lzham_size / bps;
						float decomp_time = stats[i].m_lzham_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", stats[i].m_size / total_time / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_miniz_size / bps;
						float decomp_time = stats[i].m_miniz_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", (stats[i].m_size / total_time) / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_size / bps;
						float decomp_time = 0.0f;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", (stats[i].m_size / total_time) / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_lz4_size / bps;
						float decomp_time = stats[i].m_lz4_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", (stats[i].m_size / total_time) / (1024.0f*1024.0f));
					}
#endif

					fprintf(pFile, "\n");
				}

#if 0
				for (uint j = 0; j < 64; j++)
				{
					fprintf(pFile, "%3.2f, ",  (low_bps + (j * scale_bps)) / 8.0f / (1024.0f * 1024.0f));
				}
#endif

				fclose(pFile);
			}
#else
			if (test_recursive(lzham_dll, cmd_line[0].c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL))
				exit_status = EXIT_SUCCESS;
#endif

         break;
      }
      default:
      {
         print_error("No mode specified!\n");
         print_usage();
         return EXIT_FAILURE;
      }
   }

   return exit_status;
}